

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O1

int x509_name_ex_d2i(ASN1_VALUE **val,uchar **in,long len,ASN1_ITEM *it,int opt,ASN1_TLC *ctx)

{
  uchar *__src;
  ASN1_VALUE *sk;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  OPENSSL_STACK *sk_00;
  size_t sVar4;
  void *p_00;
  size_t sVar5;
  ASN1_ITEM *it_00;
  ASN1_VALUE *a;
  uchar *p;
  ASN1_TEMPLATE *local_50;
  uchar **local_48;
  ASN1_VALUE *nm_val;
  ASN1_VALUE *intname_val;
  
  it_00 = (ASN1_ITEM *)&p;
  __src = *in;
  if (0xfffff < len) {
    len = 0x100000;
  }
  intname_val = (ASN1_VALUE *)0x0;
  p = __src;
  iVar1 = ASN1_item_ex_d2i((ASN1_VALUE **)&intname_val,&p,len,(ASN1_ITEM *)&X509_NAME_INTERNAL_it,-1
                           ,0,(char)opt,(ASN1_TLC *)0x0);
  sk = intname_val;
  if (0 < iVar1) {
    if (*val != (ASN1_VALUE *)0x0) {
      x509_name_ex_free(val,it_00);
    }
    nm_val = (ASN1_VALUE *)0x0;
    iVar2 = x509_name_ex_new(&nm_val,it_00);
    a = nm_val;
    iVar1 = 0;
    if (iVar2 == 0) {
      a = (ASN1_VALUE *)0x0;
    }
    else {
      iVar2 = BUF_MEM_grow(*(BUF_MEM **)(nm_val + 0x10),(long)p - (long)__src);
      if (CONCAT44(extraout_var,iVar2) != 0) {
        local_50 = (ASN1_TEMPLATE *)val;
        local_48 = in;
        if ((long)p - (long)__src != 0) {
          memcpy(*(void **)(*(long *)(a + 0x10) + 8),__src,(long)p - (long)__src);
        }
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
        if (sVar3 != 0) {
          sVar3 = 0;
          do {
            sk_00 = (OPENSSL_STACK *)OPENSSL_sk_value((OPENSSL_STACK *)sk,sVar3);
            sVar4 = OPENSSL_sk_num(sk_00);
            if (sVar4 != 0) {
              sVar4 = 0;
              do {
                p_00 = OPENSSL_sk_value(sk_00,sVar4);
                *(int *)((long)p_00 + 0x10) = (int)sVar3;
                sVar5 = OPENSSL_sk_push(*(OPENSSL_STACK **)a,p_00);
                if (sVar5 == 0) goto LAB_001b4d58;
                OPENSSL_sk_set(sk_00,sVar4,(void *)0x0);
                sVar4 = sVar4 + 1;
                sVar5 = OPENSSL_sk_num(sk_00);
              } while (sVar4 < sVar5);
            }
            sVar3 = sVar3 + 1;
            sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
          } while (sVar3 < sVar4);
        }
        iVar2 = x509_name_canon((X509_NAME *)a);
        if (iVar2 != 0) {
          OPENSSL_sk_pop_free_ex
                    ((OPENSSL_STACK *)sk,sk_STACK_OF_X509_NAME_ENTRY_call_free_func,
                     local_sk_X509_NAME_ENTRY_free);
          *(undefined4 *)(a + 8) = 0;
          *(ASN1_VALUE **)local_50 = a;
          *local_48 = p;
          return iVar2;
        }
      }
    }
LAB_001b4d58:
    ASN1_item_free((ASN1_VALUE *)a,(ASN1_ITEM *)&X509_NAME_it);
    OPENSSL_sk_pop_free_ex
              ((OPENSSL_STACK *)sk,sk_STACK_OF_X509_NAME_ENTRY_call_free_func,
               local_sk_X509_NAME_ENTRY_pop_free);
    ERR_put_error(0xb,0,0xc,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_name.cc"
                  ,0xd3);
  }
  return iVar1;
}

Assistant:

static int x509_name_ex_d2i(ASN1_VALUE **val, const unsigned char **in,
                            long len, const ASN1_ITEM *it, int opt,
                            ASN1_TLC *ctx) {
  const unsigned char *p = *in, *q;
  STACK_OF(STACK_OF_X509_NAME_ENTRY) *intname = NULL;
  X509_NAME *nm = NULL;
  size_t i, j;
  int ret;
  STACK_OF(X509_NAME_ENTRY) *entries;
  X509_NAME_ENTRY *entry;
  // Bound the size of an X509_NAME we are willing to parse.
  if (len > X509_NAME_MAX) {
    len = X509_NAME_MAX;
  }
  q = p;

  // Get internal representation of Name
  ASN1_VALUE *intname_val = NULL;
  ret = ASN1_item_ex_d2i(&intname_val, &p, len,
                         ASN1_ITEM_rptr(X509_NAME_INTERNAL), /*tag=*/-1,
                         /*aclass=*/0, opt, /*buf=*/NULL);
  if (ret <= 0) {
    return ret;
  }
  intname = (STACK_OF(STACK_OF_X509_NAME_ENTRY) *)intname_val;

  if (*val) {
    x509_name_ex_free(val, NULL);
  }
  ASN1_VALUE *nm_val = NULL;
  if (!x509_name_ex_new(&nm_val, NULL)) {
    goto err;
  }
  nm = (X509_NAME *)nm_val;
  // We've decoded it: now cache encoding
  if (!BUF_MEM_grow(nm->bytes, p - q)) {
    goto err;
  }
  OPENSSL_memcpy(nm->bytes->data, q, p - q);

  // Convert internal representation to X509_NAME structure
  for (i = 0; i < sk_STACK_OF_X509_NAME_ENTRY_num(intname); i++) {
    entries = sk_STACK_OF_X509_NAME_ENTRY_value(intname, i);
    for (j = 0; j < sk_X509_NAME_ENTRY_num(entries); j++) {
      entry = sk_X509_NAME_ENTRY_value(entries, j);
      entry->set = (int)i;
      if (!sk_X509_NAME_ENTRY_push(nm->entries, entry)) {
        goto err;
      }
      (void)sk_X509_NAME_ENTRY_set(entries, j, NULL);
    }
  }
  ret = x509_name_canon(nm);
  if (!ret) {
    goto err;
  }
  sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname, local_sk_X509_NAME_ENTRY_free);
  nm->modified = 0;
  *val = (ASN1_VALUE *)nm;
  *in = p;
  return ret;
err:
  X509_NAME_free(nm);
  sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname,
                                       local_sk_X509_NAME_ENTRY_pop_free);
  OPENSSL_PUT_ERROR(X509, ERR_R_ASN1_LIB);
  return 0;
}